

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autobondrot.c
# Opt level: O2

void describeXformDB(FILE *outf,xformDatabase *xdb,char *cch)

{
  int iVar1;
  atom *paVar2;
  residue_t *prVar3;
  goToRec *pgVar4;
  ulong uVar5;
  char *pcVar6;
  transformData *ptVar7;
  biasFunction *pbVar8;
  xformAtomRecords *pxVar9;
  char *pcVar10;
  uint local_44;
  
  pcVar10 = "#";
  if (cch != (char *)0x0) {
    pcVar10 = cch;
  }
  if (xdb == (xformDatabase *)0x0) {
    fwrite("NULL xformDatabase\n",0x13,1,(FILE *)outf);
    return;
  }
  fprintf((FILE *)outf,"%sAUTOBONDROT with %d variables\n",pcVar10,(ulong)(uint)xdb->nlevs);
  local_44 = 0;
  ptVar7 = (transformData *)xdb;
  do {
    ptVar7 = ptVar7->next;
    if (ptVar7 == (transformData *)0x0) {
      pgVar4 = (goToRec *)&xdb->golist;
      uVar5 = 0xffffffffffffffff;
      do {
        pgVar4 = pgVar4->next;
        uVar5 = (ulong)((int)uVar5 + 1);
      } while (pgVar4 != (goToRec *)0x0);
      fprintf((FILE *)outf,"%sread %d GO statements\n",pcVar10,uVar5);
      return;
    }
    pcVar6 = "%sROT ";
    switch(ptVar7->type) {
    case 0:
      fprintf((FILE *)outf,"%s\n",pcVar10);
      break;
    case 2:
      pcVar6 = "%sTRANS ";
    case 1:
      fprintf((FILE *)outf,pcVar6,pcVar10);
      pcVar6 = ptVar7->name;
      if (pcVar6 == (char *)0x0) {
        pcVar6 = "";
      }
      fprintf((FILE *)outf,"%s ",pcVar6);
      fprintf((FILE *)outf,"orig %g scan from %g to %g by %g\n",ptVar7->phase,ptVar7->startVal,
              ptVar7->endVal,ptVar7->stepVal);
      fprintf((FILE *)outf,"%s        AXIS(%g, %g, %g -> %g, %g, %g)\n",(ptVar7->a1).x,
              (ptVar7->a1).y,(ptVar7->a1).z,(ptVar7->a2).x,(ptVar7->a2).y,(ptVar7->a2).z,pcVar10);
      break;
    case 3:
      local_44 = local_44 + 1;
      fprintf((FILE *)outf,"%sSAVE transformation (level %d)\n",pcVar10);
      break;
    case 4:
      fprintf((FILE *)outf,"%sRESTORE transformation (level %d)\n",pcVar10,(ulong)local_44);
      local_44 = local_44 - (0 < (int)local_44);
      break;
    default:
      fprintf((FILE *)outf,"%sUNKNOWN transformation (type %d)\n",pcVar10);
    }
    pbVar8 = (biasFunction *)&ptVar7->funcs;
    while (pbVar8 = pbVar8->next, pbVar8 != (biasFunction *)0x0) {
      iVar1 = pbVar8->type;
      if (iVar1 == 2) {
        fprintf((FILE *)outf,"%s        POLYNOMIAL bias function %g*(x - %g)^%g\n",pbVar8->v,
                pbVar8->ph,pbVar8->freq,pcVar10);
      }
      else if (iVar1 == 1) {
        fprintf((FILE *)outf,"%s        COSINE bias function %g*(%g - cos(%g*(x - %g)))/2\n",
                pbVar8->v,pbVar8->shift,pbVar8->freq,pbVar8->ph,pcVar10);
      }
      else if (iVar1 == 0) {
        fprintf((FILE *)outf,"%s        CONST bias function %g\n",pbVar8->v,pcVar10);
      }
      else {
        fprintf((FILE *)outf,"%s        UNKNOWN bias function type: %d\n",pcVar10);
      }
    }
    pxVar9 = (xformAtomRecords *)&ptVar7->recs;
    while (pxVar9 = pxVar9->next, pxVar9 != (xformAtomRecords *)0x0) {
      paVar2 = pxVar9->a;
      prVar3 = paVar2->r;
      fprintf((FILE *)outf,"%s    %4.4s%c%3.3s%2s%4d%c   %8.3f%8.3f%8.3f%6.2f%6.2f      %s\n",
              (pxVar9->loc).x,(pxVar9->loc).y,(pxVar9->loc).z,(double)paVar2->occ,
              (double)paVar2->bval,pcVar10,paVar2->atomname,(ulong)(uint)(int)paVar2->altConf,
              prVar3->resname,prVar3->chain,(ulong)(uint)prVar3->resid,
              (ulong)(uint)(int)prVar3->resInsCode,prVar3->segid);
    }
  } while( true );
}

Assistant:

void describeXformDB(FILE *outf, xformDatabase* xdb, char *cch) 
{
   int n = 0, slev = 0;
   transformData *p = NULL;
   xformAtomRecords *xa = NULL;
   biasFunction *f = NULL;
   goToRec *g = NULL;

   if (cch == NULL) { cch = "#"; }

   if (xdb) 
   {/*xdb exists, write comments to .map file*/
      slev = 0;

      fprintf(outf, "%sAUTOBONDROT with %d variables\n", cch, xdb->nlevs);

      for(p = xdb->xforms; p; p = p->next) {
	 if (p->type == NULLxform) {
#ifdef DUMP_EXTRA_XDB_DESCR
	    fprintf(outf, "%sNULL transformation\n", cch);
#else
	    fprintf(outf, "%s\n", cch);
#endif
	 }
	 else if (p->type == ROTxform || p->type == TRANSxform) {
	    if (p->type == ROTxform) {
	       fprintf(outf, "%sROT ", cch);
	    }
	    else if (p->type == TRANSxform) {
	       fprintf(outf, "%sTRANS ", cch);
	    }
	    fprintf(outf, "%s ", ((p->name)?(p->name):""));
#ifdef DUMP_EXTRA_XDB_DESCR
	    fprintf(outf, "orig %g scan from %g to %g by %g (curr %g)\n",
			   p->phase, p->startVal, p->endVal,
			   p->stepVal, p->currVal);
#else
	    fprintf(outf, "orig %g scan from %g to %g by %g\n",
			   p->phase, p->startVal, p->endVal,
			   p->stepVal);
#endif
	    fprintf(outf, "%s        AXIS(%g, %g, %g -> %g, %g, %g)\n", cch,
			   p->a1.x, p->a1.y, p->a1.z,
			   p->a2.x, p->a2.y, p->a2.z);
#ifdef DUMP_EXTRA_XDB_DESCR
	    fprintf(outf, "%s        %12g %12g %12g %12g\n", cch,
			   p->tmat.element[0][0],
			   p->tmat.element[0][1],
			   p->tmat.element[0][2],
			   p->tmat.element[0][3]);
	    fprintf(outf, "%s        %12g %12g %12g %12g\n", cch,
			   p->tmat.element[1][0],
			   p->tmat.element[1][1],
			   p->tmat.element[1][2],
			   p->tmat.element[1][3]);
	    fprintf(outf, "%s        %12g %12g %12g %12g\n", cch,
			   p->tmat.element[2][0],
			   p->tmat.element[2][1],
			   p->tmat.element[2][2],
			   p->tmat.element[2][3]);
	    fprintf(outf, "%s        %12g %12g %12g %12g\n", cch,
			   p->tmat.element[3][0],
			   p->tmat.element[3][1],
			   p->tmat.element[3][2],
			   p->tmat.element[3][3]);
#endif
	 }
	 else if (p->type == SAVExform) {
	    fprintf(outf, "%sSAVE transformation (level %d)\n", cch, ++slev);
	 }
	 else if (p->type == RESTORExform) {
	    fprintf(outf, "%sRESTORE transformation (level %d)\n", cch, slev);
	    if (slev > 0) { slev--; }
	 }
	 else {
	    fprintf(outf, "%sUNKNOWN transformation (type %d)\n", cch, p->type);
	 }
	 for(f = p->funcs; f; f = f->next) {
	    if (f->type == CONSTbiasfunc) {
	       fprintf(outf, "%s        CONST bias function %g\n", cch, f->v);
	    }
	    else if (f->type == POLYbiasfunc) {
	       fprintf(outf, "%s        POLYNOMIAL bias function %g*(x - %g)^%g\n", cch,
					  f->v, f->ph, f->freq);
	    }
	    else if (f->type == COSbiasfunc) {
	       fprintf(outf, "%s        COSINE bias function %g*(%g - cos(%g*(x - %g)))/2\n", cch,
		  f->v, f->shift, f->freq, f->ph);
	    }
	    else {
	       fprintf(outf, "%s        UNKNOWN bias function type: %d\n", cch, f->type);
	    }
	 }

	 for(xa = p->recs; xa; xa = xa->next) {
	    fprintf(outf, "%s    %4.4s%c%3.3s%2s%4d%c   %8.3f%8.3f%8.3f%6.2f%6.2f      %s\n", cch,
	       xa->a->atomname, xa->a->altConf,
	       xa->a->r->resname, xa->a->r->chain,
	       xa->a->r->resid, xa->a->r->resInsCode,
	       xa->loc.x, xa->loc.y, xa->loc.z,
	       xa->a->occ, xa->a->bval, xa->a->r->segid);
	 }
      }
#ifdef DUMP_EXTRA_XDB_DESCR
      for(i = 0; i < MAX_XFORM_LEVELS; i++) {
         if (xdb->level[i]) {
	    fprintf(outf, "%sLevel%d (%s %d)\n", cch, i,
	       ((xdb->level[i]->name)?(xdb->level[i]->name):""),
	       xdb->level[i]->num);
	 }
      }
#endif
      n = 0;
      for(g = xdb->golist; g; g = g->next) {
	 ++n;
#ifdef DUMP_EXTRA_XDB_DESCR
	 fprintf(outf, "%sGO %d", cch, n);
	 for(i = 0; i < xdb->nlevs; i++) {
	    fprintf(outf, ": %g ", g->level[i]);
	 }
	 fprintf(outf, "\n");
#endif
      }
      fprintf(outf, "%sread %d GO statements\n", cch, n);
   }/*xdb exists, write comments to .map file*/
   else 
   {
      fprintf(outf, "NULL xformDatabase\n");
   }
}